

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool adios2sys::SystemTools::GetFileId(string *file,FileId *id)

{
  int iVar1;
  stat fileStat;
  UnixFileId local_c0;
  stat local_a8;
  
  iVar1 = stat((file->_M_dataplus)._M_p,&local_a8);
  if (iVar1 == 0) {
    UnixFileId::UnixFileId(&local_c0,local_a8.st_dev,local_a8.st_ino,local_a8.st_size);
    id->m_fileSize = local_c0.m_fileSize;
    id->m_volumeSerialNumber = local_c0.m_volumeSerialNumber;
    id->m_fileSerialNumber = local_c0.m_fileSerialNumber;
  }
  return iVar1 == 0;
}

Assistant:

bool SystemTools::GetFileId(const std::string& file, FileId& id)
{
#ifdef _WIN32
  HANDLE hFile =
    CreateFileW(Encoding::ToWide(file).c_str(), GENERIC_READ, FILE_SHARE_READ,
                nullptr, OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, nullptr);
  if (hFile != INVALID_HANDLE_VALUE) {
    BY_HANDLE_FILE_INFORMATION fiBuf;
    GetFileInformationByHandle(hFile, &fiBuf);
    CloseHandle(hFile);
    id = FileId(fiBuf.dwVolumeSerialNumber, fiBuf.nFileIndexHigh,
                fiBuf.nFileIndexLow);
    return true;
  } else {
    return false;
  }
#else
  struct stat fileStat;
  if (stat(file.c_str(), &fileStat) == 0) {
    id = FileId(fileStat.st_dev, fileStat.st_ino, fileStat.st_size);
    return true;
  }
  return false;
#endif
}